

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O2

string * __thiscall
anurbs::Model::get_key_abi_cxx11_(string *__return_storage_ptr__,Model *this,size_t index)

{
  const_reference pvVar1;
  const_reference pvVar2;
  
  pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(&this->m_entry_map,index);
  pvVar2 = std::
           vector<std::shared_ptr<anurbs::EntryBase>,_std::allocator<std::shared_ptr<anurbs::EntryBase>_>_>
           ::at(&this->m_entries,*pvVar1);
  (**((pvVar2->super___shared_ptr<anurbs::EntryBase,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
     _vptr_EntryBase)(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string get_key(size_t index) const
    {
        return m_entries.at(m_entry_map.at(index))->key();
    }